

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O0

void __thiscall iDynTree::LinkVelArray::LinkVelArray(LinkVelArray *this,Model *model)

{
  Model *in_RDI;
  LinkVelArray *in_stack_ffffffffffffffe0;
  
  std::vector<iDynTree::Twist,_std::allocator<iDynTree::Twist>_>::vector
            ((vector<iDynTree::Twist,_std::allocator<iDynTree::Twist>_> *)0x437eac);
  resize(in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

LinkVelArray::LinkVelArray(const Model& model)
{
    resize(model);
}